

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O3

void __thiscall choc::value::ValueView::ValueView(ValueView *this,ValueView *param_1)

{
  Content *pCVar1;
  Content *pCVar2;
  MainType MVar3;
  ComplexArray *other;
  Object *other_00;
  undefined8 uVar4;
  StringDictionary *pSVar5;
  Object *this_00;
  
  MVar3 = (param_1->type).mainType;
  pCVar1 = &(this->type).content;
  pCVar2 = &(param_1->type).content;
  (this->type).mainType = MVar3;
  (this->type).content.object = (Object *)0x0;
  (this->type).allocator = (Allocator *)0x0;
  if (MVar3 == object) {
    other_00 = pCVar2->object;
    this_00 = (Object *)malloc(0x28);
    Type::Object::Object(this_00,(Allocator *)0x0,other_00);
  }
  else {
    if (MVar3 != complexArray) {
      uVar4 = *(undefined8 *)((long)&(param_1->type).content + 8);
      pCVar1->object = pCVar2->object;
      *(undefined8 *)((long)&(this->type).content + 8) = uVar4;
      goto LAB_001e53be;
    }
    other = pCVar2->complexArray;
    this_00 = (Object *)malloc(0x18);
    Type::ComplexArray::ComplexArray((ComplexArray *)this_00,(Allocator *)0x0,other);
  }
  pCVar1->complexArray = (ComplexArray *)this_00;
LAB_001e53be:
  pSVar5 = param_1->stringDictionary;
  this->data = param_1->data;
  this->stringDictionary = pSVar5;
  return;
}

Assistant:

ValueView (const ValueView&) = default;